

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O0

void perror(char *__s)

{
  _PDCLIB_file_t *__stream;
  _PDCLIB_lc_messages_t *p_Var1;
  int *piVar2;
  char *s_local;
  
  mtx_lock(&stderr->mtx);
  if ((__s != (char *)0x0) && (*__s != '\n')) {
    fprintf((FILE *)stderr,"%s: ",__s);
  }
  piVar2 = _PDCLIB_errno_func();
  if (*piVar2 < 0x84) {
    piVar2 = _PDCLIB_errno_func();
    p_Var1 = _PDCLIB_lc_messages;
    __stream = stderr;
    if (-1 < *piVar2) {
      piVar2 = _PDCLIB_errno_func();
      fprintf((FILE *)__stream,"%s\n",p_Var1->errno_texts[*piVar2]);
      goto LAB_00103318;
    }
  }
  fprintf((FILE *)stderr,"%s\n","unknown error");
LAB_00103318:
  mtx_unlock(&stderr->mtx);
  return;
}

Assistant:

void perror( const char * s )
{
    _PDCLIB_LOCK( stderr->mtx );

    if ( ( s != NULL ) && ( s[0] != '\n' ) )
    {
        fprintf( stderr, "%s: ", s );
    }

    if ( errno >= _PDCLIB_ERRNO_MAX || errno < 0 )
    {
        fprintf( stderr, "%s\n", _PDCLIB_EUNKNOWN_TEXT );
    }
    else
    {
        fprintf( stderr, "%s\n", _PDCLIB_lc_messages->errno_texts[errno] );
    }

    _PDCLIB_UNLOCK( stderr->mtx );
    return;
}